

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddWindow.c
# Opt level: O2

int ddWindow2(DdManager *table,int low,int high)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int x;
  
  iVar3 = 0;
  if (low < high) {
    iVar3 = table->keys - table->isolated;
    while (x = low, x < high) {
      low = x + 1;
      iVar2 = cuddSwapInPlace(table,x,low);
      if (iVar2 == 0) {
        return 0;
      }
      bVar1 = iVar3 <= iVar2;
      iVar3 = iVar2;
      if ((bVar1) && (iVar3 = cuddSwapInPlace(table,x,low), iVar3 == 0)) {
        return 0;
      }
    }
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int
ddWindow2(
  DdManager * table,
  int  low,
  int  high)
{

    int x;
    int res;
    int size;

#ifdef DD_DEBUG
    assert(low >= 0 && high < table->size);
#endif

    if (high-low < 1) return(0);

    res = table->keys - table->isolated;
    for (x = low; x < high; x++) {
        size = res;
        res = cuddSwapInPlace(table,x,x+1);
        if (res == 0) return(0);
        if (res >= size) { /* no improvement: undo permutation */
            res = cuddSwapInPlace(table,x,x+1);
            if (res == 0) return(0);
        }
#ifdef DD_STATS
        if (res < size) {
            (void) fprintf(table->out,"-");
        } else {
            (void) fprintf(table->out,"=");
        }
        fflush(table->out);
#endif
    }

    return(1);

}